

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  int iVar1;
  xmlXIncludeRefPtr pxVar2;
  bool local_3d;
  int local_38;
  int start;
  int i;
  int ret;
  xmlNodePtr cur;
  xmlXIncludeRefPtr ref;
  xmlNodePtr tree_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  start = 0;
  if ((tree == (xmlNodePtr)0x0) || (tree->type == XML_NAMESPACE_DECL)) {
    ctxt_local._4_4_ = -1;
  }
  else if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    local_38 = ctxt->incNr;
    _i = tree;
    do {
      iVar1 = xmlXIncludeTestNode(ctxt,_i);
      if (iVar1 == 1) {
        ctxt->incTotal = ctxt->incTotal + 1;
        pxVar2 = xmlXIncludeExpandNode(ctxt,_i);
        if (pxVar2 != (xmlXIncludeRefPtr)0x0) {
          pxVar2->replace = 1;
        }
LAB_001d9e71:
        do {
          if (_i == tree) break;
          if (_i->next != (_xmlNode *)0x0) {
            _i = _i->next;
            break;
          }
          _i = _i->parent;
        } while (_i != (xmlNodePtr)0x0);
      }
      else {
        if ((_i->children == (_xmlNode *)0x0) ||
           ((_i->type != XML_DOCUMENT_NODE && (_i->type != XML_ELEMENT_NODE)))) goto LAB_001d9e71;
        _i = _i->children;
      }
      local_3d = _i != (xmlNodePtr)0x0 && _i != tree;
    } while (local_3d);
    for (; local_38 < ctxt->incNr; local_38 = local_38 + 1) {
      if (ctxt->incTab[local_38]->replace == 0) {
        if (ctxt->incTab[local_38]->inc != (xmlNodePtr)0x0) {
          xmlFreeNodeList(ctxt->incTab[local_38]->inc);
          ctxt->incTab[local_38]->inc = (xmlNodePtr)0x0;
        }
      }
      else {
        if ((ctxt->incTab[local_38]->inc != (xmlNodePtr)0x0) ||
           (ctxt->incTab[local_38]->emptyFb != 0)) {
          xmlXIncludeIncludeNode(ctxt,ctxt->incTab[local_38]);
        }
        ctxt->incTab[local_38]->replace = 0;
      }
      start = start + 1;
    }
    if (ctxt->isStream != 0) {
      for (local_38 = 0; local_38 < ctxt->incNr; local_38 = local_38 + 1) {
        xmlXIncludeFreeRef(ctxt->incTab[local_38]);
      }
      ctxt->incNr = 0;
    }
    ctxt_local._4_4_ = start;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return(-1);
    if (ctxt == NULL)
	return(-1);

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
            /*
             * Avoid superlinear expansion by limiting the total number
             * of replacements.
             */
            if (ctxt->incTotal >= 20)
                break;
#endif
            ctxt->incTotal++;
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            if ((ctxt->incTab[i]->inc != NULL) ||
                (ctxt->incTab[i]->emptyFb != 0)) {	/* (empty fallback) */
                xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            }
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}